

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::determineSubStruct
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
          *structure)

{
  bool bVar1;
  const_reference pvVar2;
  pointer __str;
  allocator<char> local_5d [19];
  byte local_4a;
  allocator<char> local_49;
  _Self local_48 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  *local_38;
  _Self local_30;
  borrowed_iterator_t<const_std::map<std::__cxx11::basic_string<char>,_VulkanHppGenerator::StructureData>_&>
  structIt;
  anon_class_8_1_1e35b413 isSubStruct;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  *structure_local;
  VulkanHppGenerator *this_local;
  
  pvVar2 = std::
           vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>::
           front(&(structure->second).members);
  bVar1 = std::operator==(&pvVar2->name,"sType");
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_5d)
    ;
    std::allocator<char>::~allocator(local_5d);
  }
  else {
    local_38 = structure;
    structIt._M_node = (_Base_ptr)structure;
    local_30._M_node =
         (_Base_ptr)
         std::ranges::__find_if_fn::
         operator()<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:1852:24)>
                   ((__find_if_fn *)&std::ranges::find_if,&this->m_structs,structure);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
         ::end(&this->m_structs);
    bVar1 = std::operator==(&local_30,local_48);
    local_4a = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_4a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_49);
    }
    else {
      __str = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
              ::operator->(&local_30);
      std::__cxx11::string::string((string *)__return_storage_ptr__,&__str->first);
    }
    if ((local_4a & 1) != 0) {
      std::allocator<char>::~allocator(&local_49);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::determineSubStruct( std::pair<std::string, StructureData> const & structure ) const
{
  if ( structure.second.members.front().name != "sType" )
  {
    // check if sd is a substruct of structure
    auto isSubStruct = [&structure]( std::pair<std::string, StructureData> const & sd ) noexcept
    {
      // member-by-member comparison of type and name
      auto memberIt = structure.second.members.begin();
      auto isMember = [&memberIt]( MemberData const & md ) noexcept
      {
        if ( ( md.type == memberIt->type ) && ( md.name == memberIt->name ) )
        {
          ++memberIt;
          return true;
        }
        return false;
      };

      return ( sd.second.members.size() < structure.second.members.size() ) && std::ranges::all_of( sd.second.members, isMember );
    };

    // look for a struct in m_structs that starts identically to structure
    auto structIt = std::ranges::find_if( m_structs, isSubStruct );
    return ( structIt == m_structs.end() ) ? "" : structIt->first;
  }
  return "";
}